

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTryTableCatches(WastParser *this,TryTableVector *catches)

{
  CatchKind CVar1;
  Result RVar2;
  TokenTypePair TVar3;
  TableCatch TStack_128;
  Token token;
  
  do {
    TVar3 = PeekPair(this);
    if (((ulong)TVar3._M_elems & 0xfffffffcffffffff) != 0x4c0000001e) {
      return (Result)Ok;
    }
    Consume((Token *)&TStack_128,this);
    GetLocation(&token.loc,this);
    TableCatch::TableCatch(&TStack_128,&token.loc);
    Consume(&token,this);
    CVar1 = CatchAll;
    switch(token.token_type_) {
    case Catch:
      TStack_128.kind = Catch;
      break;
    case CatchRef:
      TStack_128.kind = CatchRef;
      break;
    case CatchAllRef:
      CVar1 = CatchAllRef;
    case CatchAll:
      TStack_128.kind = CVar1;
      goto LAB_001870c6;
    default:
      abort();
    }
    RVar2 = ParseVar(this,&TStack_128.tag);
    if (RVar2.enum_ == Error) {
LAB_00187100:
      TableCatch::~TableCatch(&TStack_128);
      return (Result)Error;
    }
LAB_001870c6:
    RVar2 = ParseVar(this,&TStack_128.target);
    if ((RVar2.enum_ == Error) || (RVar2 = Expect(this,Rpar), RVar2.enum_ == Error))
    goto LAB_00187100;
    std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::emplace_back<wabt::TableCatch>
              (catches,&TStack_128);
    TableCatch::~TableCatch(&TStack_128);
  } while( true );
}

Assistant:

Result WastParser::ParseTryTableCatches(TryTableVector* catches) {
  WABT_TRACE(ParseTryTableCatches);

  while (IsTryTableCatch(PeekPair())) {
    Consume();
    TableCatch catch_(GetLocation());
    auto token = Consume();
    switch (token.token_type()) {
      case TokenType::Catch:
        catch_.kind = CatchKind::Catch;
        break;
      case TokenType::CatchRef:
        catch_.kind = CatchKind::CatchRef;
        break;
      case TokenType::CatchAll:
        catch_.kind = CatchKind::CatchAll;
        break;
      case TokenType::CatchAllRef:
        catch_.kind = CatchKind::CatchAllRef;
        break;
      default:
        WABT_UNREACHABLE;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      CHECK_RESULT(ParseVar(&catch_.tag));
    }
    CHECK_RESULT(ParseVar(&catch_.target));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  }

  return Result::Ok;
}